

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O3

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
rcu_guard::rcu_read_lock
          (rcu_guard *this,
          rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *list)

{
  __pointer_type pzVar1;
  __pointer_type pzVar2;
  bool bVar4;
  __pointer_type pzVar3;
  
  this->m_list = list;
  pzVar1 = (__pointer_type)operator_new(0x18);
  this->m_zombie = pzVar1;
  (pzVar1->next)._M_b._M_p = (__pointer_type)0x0;
  (pzVar1->owner)._M_b._M_p = this;
  pzVar1->zombie_node = (node *)0x0;
  pzVar3 = (list->m_zombie_head)._M_b._M_p;
  (pzVar1->next)._M_b._M_p = pzVar3;
  while( true ) {
    LOCK();
    pzVar2 = (list->m_zombie_head)._M_b._M_p;
    bVar4 = pzVar3 == pzVar2;
    if (bVar4) {
      (list->m_zombie_head)._M_b._M_p = pzVar1;
      pzVar2 = pzVar3;
    }
    UNLOCK();
    if (bVar4) break;
    (this->m_zombie->next)._M_b._M_p = pzVar2;
    pzVar1 = this->m_zombie;
    pzVar3 = pzVar2;
  }
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::rcu_read_lock(const rcu_list<T, M, Alloc> &list)
{
   m_list   = &list;
   m_zombie = zombie_alloc_trait::allocate(list.m_zombie_alloc, 1);
   zombie_alloc_trait::construct(list.m_zombie_alloc, m_zombie, this);
   zombie_list_node *oldNext = list.m_zombie_head.load(std::memory_order_relaxed);

   do {
      m_zombie->next.store(oldNext, std::memory_order_relaxed);
   } while (!list.m_zombie_head.compare_exchange_weak(oldNext, m_zombie));
}